

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer.cpp
# Opt level: O0

void __thiscall CMU462::PathTracer::~PathTracer(PathTracer *this)

{
  long in_RDI;
  BVHAccel *in_stack_ffffffffffffffe0;
  vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *this_00;
  
  this_00 = *(vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> **)(in_RDI + 0x70);
  if (this_00 != (vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_> *)0x0) {
    StaticScene::BVHAccel::~BVHAccel(in_stack_ffffffffffffffe0);
    operator_delete(this_00);
  }
  if (*(long **)(in_RDI + 0x80) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x80) + 8))();
  }
  if (*(long **)(in_RDI + 0x88) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x88) + 8))();
  }
  std::vector<CMU462::LoggedRay,_std::allocator<CMU462::LoggedRay>_>::~vector(this_00);
  std::
  stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
  ::~stack((stack<CMU462::StaticScene::BVHNode_*,_std::deque<CMU462::StaticScene::BVHNode_*,_std::allocator<CMU462::StaticScene::BVHNode_*>_>_>
            *)0x254dca);
  WorkQueue<CMU462::WorkItem>::~WorkQueue((WorkQueue<CMU462::WorkItem> *)0x254ddb);
  std::vector<std::thread_*,_std::allocator<std::thread_*>_>::~vector
            ((vector<std::thread_*,_std::allocator<std::thread_*>_> *)this_00);
  ImageBuffer::~ImageBuffer((ImageBuffer *)0x254dfd);
  HDRImageBuffer::~HDRImageBuffer((HDRImageBuffer *)0x254e0e);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return;
}

Assistant:

PathTracer::~PathTracer() {
  delete bvh;
  delete gridSampler;
  delete hemisphereSampler;
}